

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_MonsterRefire
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  TObjPtr<AActor> *obj;
  bool bVar1;
  int iVar2;
  PClassActor *cls;
  FState *val;
  AActor *pAVar3;
  char *pcVar4;
  int iVar5;
  AActor *self;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003e868c;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e867c:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e868c:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123a,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003e854b;
    bVar1 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e868c;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003e867c;
LAB_003e854b:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
LAB_003e86b4:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123b,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar4 = "param[paramnum].Type == REGT_INT";
    goto LAB_003e86b4;
  }
  if ((uint)numparam < 3) {
    pcVar4 = "(paramnum) < numparam";
LAB_003e86dc:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123c,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar4 = "param[paramnum].Type == REGT_INT";
    goto LAB_003e86dc;
  }
  iVar5 = param[1].field_0.i;
  iVar2 = param[2].field_0.i;
  cls = (PClassActor *)DObject::GetClass((DObject *)self);
  val = FStateLabelStorage::GetState(&StateLabels,iVar2,cls,false);
  A_FaceTarget(self);
  iVar2 = FRandom::operator()(&pr_monsterrefire);
  if (iVar2 < iVar5) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1242,
                    "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003e85cc:
    val = (FState *)0x0;
LAB_003e8654:
    VMReturn::SetPointer(ret,val,0);
    iVar5 = 1;
  }
  else {
    obj = &self->target;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (((pAVar3 == (AActor *)0x0) || (bVar1 = P_HitFriend(self), bVar1)) ||
       (pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar3->health < 1)) {
LAB_003e8647:
      if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1249,
                        "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003e8654;
      }
    }
    else {
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
      bVar1 = P_CheckSight(self,pAVar3,6);
      if (!bVar1) goto LAB_003e8647;
      if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x124b,
                        "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003e85cc;
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MonsterRefire)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT	(prob);
	PARAM_STATE	(jump);

	A_FaceTarget(self);

	if (pr_monsterrefire() < prob)
	{
		ACTION_RETURN_STATE(NULL);
	}
	if (self->target == NULL
		|| P_HitFriend (self)
		|| self->target->health <= 0
		|| !P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING|SF_SEEPASTSHOOTABLELINES) )
	{
		ACTION_RETURN_STATE(jump);
	}
	ACTION_RETURN_STATE(NULL);
}